

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# availableprofiles.c
# Opt level: O1

int check_available(void)

{
  char *profile;
  long lVar1;
  uint size;
  uint uVar2;
  int iVar3;
  int extraout_EAX;
  char **profs;
  char **ppcVar4;
  ulong uVar5;
  undefined8 uStackY_50;
  char *pcStack_38;
  
  profs = (char **)0x0;
  uStackY_50 = 0x1084df;
  size = MOJOSHADER_glAvailableProfiles
                   (lookup,(void *)0x0,(char **)0x0,0,(MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                    (void *)0x0);
  ppcVar4 = &pcStack_38;
  if (0 < (int)size) {
    lVar1 = -((ulong)size * 8 + 0xf & 0xfffffffffffffff0);
    profs = (char **)((long)&pcStack_38 + lVar1);
    *(undefined8 *)(&stack0xffffffffffffffb8 + lVar1) = 0;
    *(undefined8 *)((long)&uStackY_50 + lVar1) = 0x10851d;
    size = MOJOSHADER_glAvailableProfiles
                     (lookup,(void *)0x0,profs,size,(MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                      *(void **)(&stack0xffffffffffffffb8 + lVar1));
    ppcVar4 = (char **)((long)&pcStack_38 + lVar1);
  }
  if ((int)size < 1) {
    *(undefined8 *)((long)ppcVar4 + -8) = 0x108569;
    check_available_cold_1();
    iVar3 = extraout_EAX;
  }
  else {
    uVar5 = 0;
    do {
      profile = profs[uVar5];
      *(undefined8 *)((long)ppcVar4 + -8) = 0x10853e;
      uVar2 = MOJOSHADER_maxShaderModel(profile);
      *(undefined8 *)((long)ppcVar4 + -8) = 0x10854d;
      iVar3 = printf("%s (Shader Model %d)\n",profile,(ulong)uVar2);
      uVar5 = uVar5 + 1;
    } while (size != uVar5);
  }
  return iVar3;
}

Assistant:

static int check_available(void)
{
    const char **avail = NULL;
    int total = MOJOSHADER_glAvailableProfiles(lookup, NULL, NULL, 0, NULL, NULL, NULL);
    if (total > 0)
    {
        avail = (const char **) alloca(sizeof (const char *) * total);
        total = MOJOSHADER_glAvailableProfiles(lookup, NULL, avail, total, NULL, NULL, NULL);
    } // if

    if (total <= 0)
        fprintf(stderr, "No profiles available.\n");
    else
    {
        int i;
        for (i = 0; i < total; i++)
        {
            printf("%s (Shader Model %d)\n", avail[i],
                   MOJOSHADER_maxShaderModel(avail[i]));
        } // for
    } // else

    return 0;
}